

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

uint64_t poplar::vbyte::encode(uint8_t *codes,uint64_t val)

{
  uint64_t uVar1;
  
  uVar1 = 1;
  for (; 0x7f < val; val = val >> 7) {
    codes[uVar1 - 1] = (byte)val | 0x80;
    uVar1 = uVar1 + 1;
  }
  codes[uVar1 - 1] = (byte)val;
  return uVar1;
}

Assistant:

inline uint64_t encode(uint8_t* codes, uint64_t val) {
    uint64_t i = 0;
    while (127ULL < val) {
        codes[i++] = static_cast<uint8_t>((val & 127ULL) | 0x80ULL);
        val >>= 7;
    }
    codes[i++] = static_cast<uint8_t>(val & 127ULL);
    return i;
}